

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_listener_get(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int local_3c;
  int rv;
  nni_ws_listener *l;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  local_3c = nni_getopt(ws_listener_options,name,arg,buf,szp,t);
  if (local_3c == 9) {
    local_3c = nni_http_server_get(*(nni_http_server **)((long)arg + 0x50),name,buf,szp,t);
  }
  return local_3c;
}

Assistant:

static int
ws_listener_get(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;

	rv = nni_getopt(ws_listener_options, name, l, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_http_server_get(l->server, name, buf, szp, t);
	}
	return (rv);
}